

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScriptNum * __thiscall CScriptNum::operator-=(CScriptNum *this,CScriptNum *rhs)

{
  long lVar1;
  CScriptNum *pCVar2;
  long in_FS_OFFSET;
  int64_t *unaff_retaddr;
  CScriptNum *in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = operator-=(in_stack_00000008,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline CScriptNum& operator-=( const CScriptNum& rhs)       { return operator-=(rhs.m_value);  }